

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::doJSON(QPDFJob *this,QPDF *pdf,Pipeline *p)

{
  size_t sVar1;
  bool bVar2;
  size_type sVar3;
  Pipeline *pPVar4;
  string *psVar5;
  element_type *peVar6;
  undefined7 uStack_100;
  bool first;
  Pipeline *p_local;
  string decode_level_str;
  allocator<char> local_c9;
  JSON schema;
  JSON j_params;
  undefined1 local_98 [16];
  shared_ptr<Pl_String> pl_str;
  __shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> local_70;
  string captured_json;
  JSON local_40;
  
  captured_json._M_dataplus._M_p = (pointer)&captured_json.field_2;
  captured_json._M_string_length = 0;
  captured_json.field_2._M_local_buf[0] = '\0';
  pl_str.super___shared_ptr<Pl_String,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  pl_str.super___shared_ptr<Pl_String,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_local = p;
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      test_json_schema == true) {
    std::make_shared<Pl_String,char_const(&)[13],Pipeline*&,std::__cxx11::string&>
              ((char (*) [13])&decode_level_str,(Pipeline **)"capture json",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_local);
    std::__shared_ptr<Pl_String,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&pl_str.super___shared_ptr<Pl_String,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Pl_String,_(__gnu_cxx::_Lock_policy)2> *)&decode_level_str);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&decode_level_str._M_string_length);
    p_local = &(pl_str.super___shared_ptr<Pl_String,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_Pipeline;
  }
  first = true;
  JSON::writeDictionaryOpen(p_local,&first,0);
  pPVar4 = p_local;
  peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar6->json_output == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decode_level_str,"version",(allocator<char> *)&j_params);
    JSON::makeInt(CONCAT17(first,uStack_100));
    JSON::writeDictionaryItem(pPVar4,&first,&decode_level_str,&schema,1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&schema.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&decode_level_str);
    JSON::makeDictionary();
    decode_level_str._M_dataplus._M_p = (pointer)&decode_level_str.field_2;
    decode_level_str._M_string_length = 0;
    decode_level_str.field_2._M_allocated_capacity =
         decode_level_str.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        decode_level < 4) {
      std::__cxx11::string::assign((char *)&decode_level_str);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&schema,"decodelevel",&local_c9);
    JSON::makeString((string *)local_98);
    JSON::addDictionaryMember(&local_40,(string *)&j_params,&schema);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
    std::__cxx11::string::~string((string *)&schema);
    pPVar4 = p_local;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&schema,"parameters",(allocator<char> *)local_98);
    JSON::writeDictionaryItem(pPVar4,&first,(string *)&schema,&j_params,1);
    std::__cxx11::string::~string((string *)&schema);
    std::__cxx11::string::~string((string *)&decode_level_str);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&j_params.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  sVar1 = *(size_t *)((long)&(peVar6->json_keys)._M_t._M_impl.super__Rb_tree_header + 0x20);
  if (sVar1 == 0) {
LAB_001691c2:
    doJSONPages(this,p_local,&first,pdf);
    if (sVar1 != 0) goto LAB_001691dc;
LAB_0016921b:
    doJSONPageLabels(this,p_local,&first,pdf);
    if (sVar1 != 0) goto LAB_00169235;
LAB_00169274:
    psVar5 = (string *)this;
    doJSONAcroform(this,p_local,&first,pdf);
    if (sVar1 != 0) goto LAB_0016928e;
LAB_001692cd:
    doJSONAttachments((QPDFJob *)psVar5,p_local,&first,pdf);
    if (sVar1 != 0) goto LAB_001692e4;
LAB_00169323:
    doJSONEncrypt(this,p_local,&first,pdf);
    if (sVar1 != 0) goto LAB_0016933d;
LAB_0016937c:
    doJSONOutlines(this,p_local,&first,pdf);
    if (sVar1 != 0) goto LAB_0016939a;
LAB_00169425:
    doJSONObjects(this,p_local,&first,pdf);
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar6->json_version != 1) goto LAB_0016949d;
    if (sVar1 != 0) goto LAB_0016944c;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decode_level_str,"pages",(allocator<char> *)&schema);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar6->json_keys,&decode_level_str);
    std::__cxx11::string::~string((string *)&decode_level_str);
    if (sVar3 != 0) goto LAB_001691c2;
LAB_001691dc:
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decode_level_str,"pagelabels",(allocator<char> *)&schema);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar6->json_keys,&decode_level_str);
    std::__cxx11::string::~string((string *)&decode_level_str);
    if (sVar3 != 0) goto LAB_0016921b;
LAB_00169235:
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decode_level_str,"acroform",(allocator<char> *)&schema);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar6->json_keys,&decode_level_str);
    std::__cxx11::string::~string((string *)&decode_level_str);
    if (sVar3 != 0) goto LAB_00169274;
LAB_0016928e:
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decode_level_str,"attachments",(allocator<char> *)&schema);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar6->json_keys,&decode_level_str);
    psVar5 = &decode_level_str;
    std::__cxx11::string::~string((string *)psVar5);
    if (sVar3 != 0) goto LAB_001692cd;
LAB_001692e4:
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decode_level_str,"encrypt",(allocator<char> *)&schema);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar6->json_keys,&decode_level_str);
    std::__cxx11::string::~string((string *)&decode_level_str);
    if (sVar3 != 0) goto LAB_00169323;
LAB_0016933d:
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decode_level_str,"outlines",(allocator<char> *)&schema);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar6->json_keys,&decode_level_str);
    std::__cxx11::string::~string((string *)&decode_level_str);
    if (sVar3 != 0) goto LAB_0016937c;
LAB_0016939a:
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decode_level_str,"objects",(allocator<char> *)&j_params);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar6->json_keys,&decode_level_str);
    if (sVar3 != 0) {
      std::__cxx11::string::~string((string *)&decode_level_str);
      goto LAB_00169425;
    }
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&schema,"qpdf",(allocator<char> *)local_98);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar6->json_keys,(key_type *)&schema);
    std::__cxx11::string::~string((string *)&schema);
    std::__cxx11::string::~string((string *)&decode_level_str);
    if (sVar3 != 0) goto LAB_00169425;
    peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar6->json_version != 1) goto LAB_0016949d;
LAB_0016944c:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decode_level_str,"objectinfo",(allocator<char> *)&schema);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar6->json_keys,&decode_level_str);
    std::__cxx11::string::~string((string *)&decode_level_str);
    if (sVar3 == 0) goto LAB_0016949d;
  }
  doJSONObjectinfo(this,p_local,&first,pdf);
LAB_0016949d:
  JSON::writeDictionaryClose(p_local,first,0);
  Pipeline::operator<<(p_local,"\n");
  peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar6->test_json_schema == true) {
    json_schema((QPDFJob *)&schema,peVar6->json_version,&peVar6->json_keys);
    decode_level_str._M_dataplus._M_p = (pointer)&decode_level_str;
    decode_level_str.field_2._M_allocated_capacity = 0;
    decode_level_str._M_string_length = (size_type)decode_level_str._M_dataplus._M_p;
    JSON::parse(&j_params,&captured_json);
    std::__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,(__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)&schema);
    bVar2 = JSON::checkSchema(&j_params,(JSON *)&local_70,
                              (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&decode_level_str);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    if (!bVar2) {
      QPDFLogger::error((((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,"QPDFJob didn\'t create JSON that complies with its own rules.\n");
      psVar5 = &decode_level_str;
      while (psVar5 = (string *)
                      (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&psVar5->_M_dataplus)->_M_impl)._M_node.super__List_node_base._M_next,
            psVar5 != &decode_level_str) {
        QPDFLogger::getError
                  ((QPDFLogger *)local_98,
                   SUB81((((this->m).
                           super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0)
                  );
        pPVar4 = Pipeline::operator<<((Pipeline *)local_98._0_8_,(string *)&psVar5->field_2);
        Pipeline::operator<<(pPVar4,"\n");
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&j_params.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&decode_level_str);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&schema.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pl_str.super___shared_ptr<Pl_String,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&captured_json);
  return;
}

Assistant:

void
QPDFJob::doJSON(QPDF& pdf, Pipeline* p)
{
    // qpdf guarantees that no new top-level keys whose names start with "x-" will be added. These
    // are reserved for users.

    std::string captured_json;
    std::shared_ptr<Pl_String> pl_str;
    if (m->test_json_schema) {
        pl_str = std::make_shared<Pl_String>("capture json", p, captured_json);
        p = pl_str.get();
    }

    bool first = true;
    JSON::writeDictionaryOpen(p, first, 0);

    if (m->json_output) {
        // Exclude version and parameters to keep the output file minimal. The JSON version is
        // inside the "qpdf" key for version 2.
    } else {
        // This version is updated every time a non-backward-compatible change is made to the JSON
        // format. Clients of the JSON are to ignore unrecognized keys, so we only update the
        // version of a key disappears or if its value changes meaning.
        JSON::writeDictionaryItem(p, first, "version", JSON::makeInt(m->json_version), 1);
        JSON j_params = JSON::makeDictionary();
        std::string decode_level_str;
        switch (m->decode_level) {
        case qpdf_dl_none:
            decode_level_str = "none";
            break;
        case qpdf_dl_generalized:
            decode_level_str = "generalized";
            break;
        case qpdf_dl_specialized:
            decode_level_str = "specialized";
            break;
        case qpdf_dl_all:
            decode_level_str = "all";
            break;
        }
        j_params.addDictionaryMember("decodelevel", JSON::makeString(decode_level_str));
        JSON::writeDictionaryItem(p, first, "parameters", j_params, 1);
    }
    bool all_keys = m->json_keys.empty();
    // The list of selectable top-level keys id duplicated in the following places: job.yml,
    // QPDFJob::json_schema, and QPDFJob::doJSON.

    // We do pages and pagelabels first since they have the side effect of repairing the pages tree,
    // which could potentially impact object references in remaining items.
    if (all_keys || m->json_keys.count("pages")) {
        doJSONPages(p, first, pdf);
    }
    if (all_keys || m->json_keys.count("pagelabels")) {
        doJSONPageLabels(p, first, pdf);
    }

    // The non-special keys are output in alphabetical order, but the order doesn't actually matter.
    if (all_keys || m->json_keys.count("acroform")) {
        doJSONAcroform(p, first, pdf);
    }
    if (all_keys || m->json_keys.count("attachments")) {
        doJSONAttachments(p, first, pdf);
    }
    if (all_keys || m->json_keys.count("encrypt")) {
        doJSONEncrypt(p, first, pdf);
    }
    if (all_keys || m->json_keys.count("outlines")) {
        doJSONOutlines(p, first, pdf);
    }

    // We do objects last so their information is consistent with repairing the page tree. To see
    // the original file with any page tree problems and the page tree not flattened, select
    // qpdf/objects/objectinfo without other keys.
    if (all_keys || m->json_keys.count("objects") || m->json_keys.count("qpdf")) {
        doJSONObjects(p, first, pdf);
    }
    if (m->json_version == 1) {
        // "objectinfo" is not needed for version >1 since you can tell streams from other objects
        // in "objects".
        if (all_keys || m->json_keys.count("objectinfo")) {
            doJSONObjectinfo(p, first, pdf);
        }
    }

    JSON::writeDictionaryClose(p, first, 0);
    *p << "\n";

    if (m->test_json_schema) {
        // Check against schema
        JSON schema = json_schema(m->json_version, &m->json_keys);
        std::list<std::string> errors;
        JSON captured = JSON::parse(captured_json);
        if (!captured.checkSchema(schema, errors)) {
            m->log->error("QPDFJob didn't create JSON that complies with its own rules.\n");
            for (auto const& error: errors) {
                *m->log->getError() << error << "\n";
            }
        }
    }
}